

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O2

CURLcode base64_encode(char *table64,char *inputbuff,size_t insize,char **outptr,size_t *outlen)

{
  uint uVar1;
  char *pcVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  byte bVar6;
  int iVar7;
  CURLcode CVar8;
  char *pcVar9;
  long lVar10;
  uchar uVar11;
  uint uVar12;
  char *format;
  char *buffer;
  char *in_stack_ffffffffffffffa8;
  uchar ibuf [3];
  
  *outptr = (char *)0x0;
  *outlen = 0;
  if (insize == 0) {
    insize = strlen(inputbuff);
  }
  pcVar9 = (char *)(*Curl_cmalloc)((insize * 4) / 3 + 4);
  if (pcVar9 == (char *)0x0) {
    CVar8 = CURLE_OUT_OF_MEMORY;
  }
  else {
    pcVar2 = table64 + 0x40;
    buffer = pcVar9;
    while (insize != 0) {
      iVar7 = 0;
      for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
        if (insize == 0) {
          uVar11 = '\0';
          insize = 0;
        }
        else {
          iVar7 = iVar7 + 1;
          uVar11 = *inputbuff;
          inputbuff = (char *)((uchar *)inputbuff + 1);
          insize = insize - 1;
        }
        ibuf[lVar10] = uVar11;
      }
      bVar6 = ibuf[0] >> 2;
      uVar12 = (uint)(ibuf[1] >> 4) | (ibuf[0] & 3) << 4;
      uVar1 = (uint)(ibuf[2] >> 6) + (ibuf[1] & 0xf) * 4;
      if (iVar7 == 2) {
        cVar3 = table64[bVar6];
        cVar4 = table64[uVar12];
        cVar5 = table64[uVar1];
        format = "%c%c%c%s";
        in_stack_ffffffffffffffa8 = pcVar2;
LAB_00426f72:
        iVar7 = curl_msnprintf(buffer,5,format,(ulong)(uint)(int)cVar3,(ulong)(uint)(int)cVar4,
                               (ulong)(uint)(int)cVar5,in_stack_ffffffffffffffa8);
      }
      else {
        if (iVar7 != 1) {
          cVar3 = table64[bVar6];
          cVar4 = table64[uVar12];
          cVar5 = table64[uVar1];
          format = "%c%c%c%c";
          in_stack_ffffffffffffffa8 =
               (char *)CONCAT44((int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                                (int)table64[ibuf[2] & 0x3f]);
          goto LAB_00426f72;
        }
        in_stack_ffffffffffffffa8 = pcVar2;
        iVar7 = curl_msnprintf(buffer,5,"%c%c%s%s",(ulong)(uint)(int)table64[bVar6],
                               (ulong)(uint)(int)table64[uVar12],pcVar2,pcVar2);
      }
      buffer = buffer + iVar7;
    }
    *buffer = '\0';
    *outptr = pcVar9;
    *outlen = (long)buffer - (long)pcVar9;
    CVar8 = CURLE_OK;
  }
  return CVar8;
}

Assistant:

static CURLcode base64_encode(const char *table64,
                              const char *inputbuff, size_t insize,
                              char **outptr, size_t *outlen)
{
  unsigned char ibuf[3];
  unsigned char obuf[4];
  int i;
  int inputparts;
  char *output;
  char *base64data;
  const char *indata = inputbuff;
  const char *padstr = &table64[64];    /* Point to padding string. */

  *outptr = NULL;
  *outlen = 0;

  if(!insize)
    insize = strlen(indata);

#if SIZEOF_SIZE_T == 4
  if(insize > UINT_MAX/4)
    return CURLE_OUT_OF_MEMORY;
#endif

  base64data = output = malloc(insize * 4 / 3 + 4);
  if(!output)
    return CURLE_OUT_OF_MEMORY;

  while(insize > 0) {
    for(i = inputparts = 0; i < 3; i++) {
      if(insize > 0) {
        inputparts++;
        ibuf[i] = (unsigned char) *indata;
        indata++;
        insize--;
      }
      else
        ibuf[i] = 0;
    }

    obuf[0] = (unsigned char)  ((ibuf[0] & 0xFC) >> 2);
    obuf[1] = (unsigned char) (((ibuf[0] & 0x03) << 4) | \
                               ((ibuf[1] & 0xF0) >> 4));
    obuf[2] = (unsigned char) (((ibuf[1] & 0x0F) << 2) | \
                               ((ibuf[2] & 0xC0) >> 6));
    obuf[3] = (unsigned char)   (ibuf[2] & 0x3F);

    switch(inputparts) {
    case 1: /* only one byte read */
      i = msnprintf(output, 5, "%c%c%s%s",
                    table64[obuf[0]],
                    table64[obuf[1]],
                    padstr,
                    padstr);
      break;

    case 2: /* two bytes read */
      i = msnprintf(output, 5, "%c%c%c%s",
                    table64[obuf[0]],
                    table64[obuf[1]],
                    table64[obuf[2]],
                    padstr);
      break;

    default:
      i = msnprintf(output, 5, "%c%c%c%c",
                    table64[obuf[0]],
                    table64[obuf[1]],
                    table64[obuf[2]],
                    table64[obuf[3]]);
      break;
    }
    output += i;
  }

  /* Zero terminate */
  *output = '\0';

  /* Return the pointer to the new data (allocated memory) */
  *outptr = base64data;

  /* Return the length of the new data */
  *outlen = output - base64data;

  return CURLE_OK;
}